

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTests.c
# Opt level: O1

void runUtilTests(void)

{
  _Bool _Var1;
  SkeinSize_t SVar2;
  int iVar3;
  uint8_t *puVar4;
  size_t size;
  arguments a1;
  arguments a3;
  arguments a2;
  arguments local_e8;
  undefined1 local_8f;
  arguments local_88;
  arguments local_48;
  
  printf("testIsGreaterThanThreeBlocks() ");
  local_e8.state_size = Skein256;
  local_48.state_size = Skein256;
  local_88.state_size = Skein256;
  local_e8.file_size = 0;
  local_48.file_size = 0x60;
  local_88.file_size = 0x61;
  _Var1 = isGreaterThanThreeBlocks(&local_e8);
  if (_Var1) {
    __assert_fail("!isGreaterThanThreeBlocks(&a1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0xd,"void testIsGreaterThanThreeBlocks()");
  }
  _Var1 = isGreaterThanThreeBlocks(&local_48);
  if (_Var1) {
    __assert_fail("!isGreaterThanThreeBlocks(&a2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0xe,"void testIsGreaterThanThreeBlocks()");
  }
  _Var1 = isGreaterThanThreeBlocks(&local_88);
  if (!_Var1) {
    __assert_fail("isGreaterThanThreeBlocks(&a3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0xf,"void testIsGreaterThanThreeBlocks()");
  }
  local_e8.state_size = Skein512;
  local_48.state_size = Skein512;
  local_88.state_size = Skein512;
  local_e8.file_size = 0;
  local_48.file_size = 0xc0;
  local_88.file_size = 0xc1;
  _Var1 = isGreaterThanThreeBlocks(&local_e8);
  if (_Var1) {
    __assert_fail("!isGreaterThanThreeBlocks(&a1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x15,"void testIsGreaterThanThreeBlocks()");
  }
  _Var1 = isGreaterThanThreeBlocks(&local_48);
  if (_Var1) {
    __assert_fail("!isGreaterThanThreeBlocks(&a2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x16,"void testIsGreaterThanThreeBlocks()");
  }
  _Var1 = isGreaterThanThreeBlocks(&local_88);
  if (!_Var1) {
    __assert_fail("isGreaterThanThreeBlocks(&a3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x17,"void testIsGreaterThanThreeBlocks()");
  }
  local_e8.state_size = Skein1024;
  local_48.state_size = Skein1024;
  local_88.state_size = Skein1024;
  local_e8.file_size = 0;
  local_48.file_size = 0x180;
  local_88.file_size = 0x181;
  _Var1 = isGreaterThanThreeBlocks(&local_e8);
  if (_Var1) {
    __assert_fail("!isGreaterThanThreeBlocks(&a1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x1d,"void testIsGreaterThanThreeBlocks()");
  }
  _Var1 = isGreaterThanThreeBlocks(&local_48);
  if (_Var1) {
    __assert_fail("!isGreaterThanThreeBlocks(&a2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x1e,"void testIsGreaterThanThreeBlocks()");
  }
  _Var1 = isGreaterThanThreeBlocks(&local_88);
  if (!_Var1) {
    __assert_fail("isGreaterThanThreeBlocks(&a3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x1f,"void testIsGreaterThanThreeBlocks()");
  }
  puts("passed");
  printf("testValidSize() ");
  _Var1 = validSize(0x100);
  if (!_Var1) {
    __assert_fail("validSize(Skein256)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x28,"void testValidSize()");
  }
  _Var1 = validSize(0x200);
  if (!_Var1) {
    __assert_fail("validSize(Skein512)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x29,"void testValidSize()");
  }
  _Var1 = validSize(0x400);
  if (!_Var1) {
    __assert_fail("validSize(Skein1024)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x2a,"void testValidSize()");
  }
  _Var1 = validSize(0x100);
  if (!_Var1) {
    __assert_fail("validSize(Threefish256)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x2b,"void testValidSize()");
  }
  _Var1 = validSize(0x200);
  if (!_Var1) {
    __assert_fail("validSize(Threefish512)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x2c,"void testValidSize()");
  }
  _Var1 = validSize(0x400);
  if (!_Var1) {
    __assert_fail("validSize(Threefish1024)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x2d,"void testValidSize()");
  }
  _Var1 = validSize(0);
  if (_Var1) {
    __assert_fail("!validSize(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x2f,"void testValidSize()");
  }
  _Var1 = validSize(0xe0);
  if (_Var1) {
    __assert_fail("!validSize(224)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x30,"void testValidSize()");
  }
  _Var1 = validSize(0x80);
  if (_Var1) {
    __assert_fail("!validSize(128)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x31,"void testValidSize()");
  }
  puts("passed");
  printf("testGetSkeinSize() ");
  local_e8.password._0_4_ = 0;
  local_e8.key_file = (uint8_t *)0x0;
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein512) {
    __assert_fail("getSkeinSize(test_key) == Skein512",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x3d,"void testGetSkeinSize()");
  }
  local_e8.key_file = (uint8_t *)CONCAT62(local_e8.key_file._2_6_,0x30);
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein512) {
    __assert_fail("getSkeinSize(test_key) == Skein512",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x3f,"void testGetSkeinSize()");
  }
  local_e8.key_file._0_4_ = 0x363532;
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein256) {
    __assert_fail("getSkeinSize(test_key) == Skein256",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x41,"void testGetSkeinSize()");
  }
  local_e8.key_file._0_4_ = 0x323135;
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein512) {
    __assert_fail("getSkeinSize(test_key) == Skein512",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x43,"void testGetSkeinSize()");
  }
  local_e8.key_file._4_4_ = local_e8.key_file._4_4_ & 0xffffff00;
  local_e8.key_file = (uint8_t *)CONCAT44(local_e8.key_file._4_4_,0x34323031);
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein1024) {
    __assert_fail("getSkeinSize(test_key) == Skein1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x45,"void testGetSkeinSize()");
  }
  local_e8.key_file = (uint8_t *)CONCAT26(local_e8.key_file._6_2_,0x6700000000);
  local_e8.key_file._0_4_ = 0x72616c62;
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein512) {
    __assert_fail("getSkeinSize(test_key) == Skein512",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x47,"void testGetSkeinSize()");
  }
  local_e8.key_file._4_4_ = local_e8.key_file._4_4_ & 0xffffff00;
  local_e8.key_file._0_4_ = 0x45464153;
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein256) {
    __assert_fail("getSkeinSize(test_key) == Skein256",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x49,"void testGetSkeinSize()");
  }
  local_e8.key_file._4_4_ = local_e8.key_file._4_4_ & 0xffffff00;
  local_e8.key_file._0_4_ = 0x65666153;
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein256) {
    __assert_fail("getSkeinSize(test_key) == Skein256",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x4b,"void testGetSkeinSize()");
  }
  local_e8.key_file._4_4_ = local_e8.key_file._4_4_ & 0xffffff00;
  local_e8.key_file = (uint8_t *)CONCAT44(local_e8.key_file._4_4_,0x65666173);
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein256) {
    __assert_fail("getSkeinSize(test_key) == Skein256",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x4d,"void testGetSkeinSize()");
  }
  local_e8.key_file = (uint8_t *)CONCAT17(local_e8.key_file._7_1_,0x455255000000);
  local_e8.key_file = (uint8_t *)CONCAT44(local_e8.key_file._4_4_,0x55434553);
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein512) {
    __assert_fail("getSkeinSize(test_key) == Skein512",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x4f,"void testGetSkeinSize()");
  }
  local_e8.key_file = (uint8_t *)CONCAT17(local_e8.key_file._7_1_,0x657275000000);
  local_e8.key_file = (uint8_t *)CONCAT44(local_e8.key_file._4_4_,0x75636553);
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein512) {
    __assert_fail("getSkeinSize(test_key) == Skein512",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x51,"void testGetSkeinSize()");
  }
  local_e8.key_file = (uint8_t *)CONCAT17(local_e8.key_file._7_1_,0x657275000000);
  local_e8.key_file = (uint8_t *)CONCAT44(local_e8.key_file._4_4_,0x75636573);
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein512) {
    __assert_fail("getSkeinSize(test_key) == Skein512",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x53,"void testGetSkeinSize()");
  }
  local_e8.key_file = (uint8_t *)0x5250455255545546;
  local_e8.password._0_4_ = 0x464f4f;
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 != Skein1024) {
    __assert_fail("getSkeinSize(test_key) == Skein1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x55,"void testGetSkeinSize()");
  }
  local_e8.key_file = (uint8_t *)0x7250657275747546;
  local_e8.password._0_4_ = 0x666f6f;
  SVar2 = getSkeinSize((uint8_t *)&local_e8);
  if (SVar2 == Skein1024) {
    local_e8.key_file = (uint8_t *)0x7270657275747566;
    local_e8.password._0_4_ = 0x666f6f;
    SVar2 = getSkeinSize((uint8_t *)&local_e8);
    if (SVar2 != Skein1024) {
      __assert_fail("getSkeinSize(test_key) == Skein1024",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                    ,0x59,"void testGetSkeinSize()");
    }
    puts("passed");
    printf("testBinToHex() ");
    puVar4 = binToHex((uint8_t *)0x0,0xffffffffffffffff);
    if (puVar4 != (uint8_t *)0x0) {
      __assert_fail("binToHex(NULL, SIZE_MAX) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                    ,0x62,"void testBinToHex()");
    }
    puVar4 = binToHex((uint8_t *)0x0,0);
    if (puVar4 != (uint8_t *)0x0) {
      __assert_fail("binToHex(NULL, 0) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                    ,99,"void testBinToHex()");
    }
    puVar4 = (uint8_t *)calloc(0x2d,1);
    local_8f = 0;
    memcpy(&local_e8,
           "54686520717569636B2062726F776E20666F78206A756D7073206F76657220746865206C617A7920646F6721"
           ,0x59);
    builtin_memcpy(puVar4,"The quick brown fox jumps over the lazy dog!",0x2d);
    iVar3 = strcmp((char *)puVar4,"The quick brown fox jumps over the lazy dog!");
    if (iVar3 == 0) {
      size = strlen((char *)puVar4);
      puVar4 = binToHex(puVar4,size);
      iVar3 = strcmp((char *)puVar4,(char *)&local_e8);
      if (iVar3 == 0) {
        free(puVar4);
        puts("passed");
        return;
      }
      __assert_fail("strcmp((char*)test_bfr, (char*)exp_hex) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                    ,0x6c,"void testBinToHex()");
    }
    __assert_fail("strcmp((char*)test_bfr, \"The quick brown fox jumps over the lazy dog!\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                  ,0x6a,"void testBinToHex()");
  }
  __assert_fail("getSkeinSize(test_key) == Skein1024",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                ,0x57,"void testGetSkeinSize()");
}

Assistant:

static void testIsGreaterThanThreeBlocks()
{
    printf("testIsGreaterThanThreeBlocks() ");

    arguments a1, a2, a3;

    a1.state_size = Skein256; a2.state_size = Skein256; a3.state_size = Skein256;
    a1.file_size = 0;
    a2.file_size = (Skein256/8)*3;
    a3.file_size = ((Skein256/8)*3)+1;
    assert(!isGreaterThanThreeBlocks(&a1));
    assert(!isGreaterThanThreeBlocks(&a2));
    assert(isGreaterThanThreeBlocks(&a3));

    a1.state_size = Skein512; a2.state_size = Skein512; a3.state_size = Skein512;
    a1.file_size = 0;
    a2.file_size = (Skein512/8)*3;
    a3.file_size = ((Skein512/8)*3)+1;
    assert(!isGreaterThanThreeBlocks(&a1));
    assert(!isGreaterThanThreeBlocks(&a2));
    assert(isGreaterThanThreeBlocks(&a3));

    a1.state_size = Skein1024; a2.state_size = Skein1024; a3.state_size = Skein1024;
    a1.file_size = 0;
    a2.file_size = (Skein1024/8)*3;
    a3.file_size = ((Skein1024/8)*3)+1;
    assert(!isGreaterThanThreeBlocks(&a1));
    assert(!isGreaterThanThreeBlocks(&a2));
    assert(isGreaterThanThreeBlocks(&a3));

    printf("passed\n");
}